

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfftpack.c
# Opt level: O0

int dst_forward(fft_t *f,double *data)

{
  int iVar1;
  double *in_RSI;
  int *in_RDI;
  double dVar2;
  double dVar3;
  int *unaff_retaddr;
  int *in_stack_00000008;
  double *in_stack_00000020;
  int n_1;
  double m_1;
  int *in_stack_00000030;
  int n;
  double m;
  double m0;
  int ier;
  int local_44;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if ((in_RDI == (int *)0x0) || (in_RSI == (double *)0x0)) {
    iVar4 = -1;
  }
  else {
    iVar4 = 0;
    if (in_RDI[10] != 0) {
      dVar2 = sqrt(1.0 / (double)in_RDI[4]);
      dVar3 = sqrt(0.5 / (double)in_RDI[4]);
      *in_RSI = dVar2 * *in_RSI;
      for (local_34 = 1; local_34 < in_RDI[4]; local_34 = local_34 + 1) {
        in_RSI[local_34] = dVar3 * in_RSI[local_34];
      }
    }
    sinq1f_(in_stack_00000008,unaff_retaddr,
            (double *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,in_RSI,
            (int *)CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_00000020,(int *)m_1,
            in_stack_00000030);
    if (in_RDI[10] != 0) {
      iVar1 = in_RDI[4];
      for (local_44 = 0; local_44 < in_RDI[4]; local_44 = local_44 + 1) {
        in_RSI[local_44] = (double)iVar1 * in_RSI[local_44];
      }
    }
    if (iVar4 == 0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int dst_forward(fft_t *f, fft_real_t *data){
  if (!f || !data)
    return -1;
  int ier=0;
  if (f->ortho){
    fft_real_t m0,m;
    m0 = sqrt(1.0/f->n);
    m  = sqrt(0.5/f->n);
    data[0]*=m0;
    int n;
    for (n=1; n<f->n; n++)
      data[n] *= m;
  }
  sinq1f_(&f->n, &f->inc, data, &f->n, f->save, &f->lensav, f->work, &f->lenwork, &ier);
  if (f->ortho){
    fft_real_t m = f->n;
    int n;
    for (n=0; n<f->n; n++)
      data[n] *= m;
  }
  if (ier)
    return ier;
  return 0;
}